

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fault.cc
# Opt level: O1

XMLWriter * __thiscall kratos::XMLWriter::attr<unsigned_int>(XMLWriter *this,string *key,uint value)

{
  XMLWriter *pXVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  ulong local_58 [3];
  string local_40;
  
  local_58[0] = (ulong)value;
  format_str.size_ = 2;
  format_str.data_ = (char *)0x3;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_58;
  fmt::v7::detail::vformat_abi_cxx11_(&local_40,(detail *)0x40eac2,format_str,args);
  pXVar1 = attr(this,key,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return pXVar1;
}

Assistant:

XMLWriter &attr(const std::string &key, T value) {
        return attr(key, ::format("{0}", value));
    }